

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatMap.c
# Opt level: O0

int Sbm_ManCreateCnf(Sbm_Man_t *p)

{
  sat_solver *psVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  int *end;
  int *piVar5;
  Vec_Int_t *local_48;
  Vec_Int_t *vLitsPrev;
  Vec_Int_t *vCutOne;
  Vec_Int_t *vLits;
  int value;
  int Lits [2];
  int Lit;
  int k;
  int i;
  Sbm_Man_t *p_local;
  
  iVar2 = Sbm_ManCheckSol(p,p->vSolCuts);
  if (iVar2 == 0) {
    p_local._4_4_ = 0;
  }
  else {
    iVar2 = p->FirstVar;
    iVar3 = sat_solver_nvars(p->pSat);
    if (iVar2 != iVar3) {
      __assert_fail("p->FirstVar == sat_solver_nvars(p->pSat)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatMap.c"
                    ,0x9d,"int Sbm_ManCreateCnf(Sbm_Man_t *)");
    }
    psVar1 = p->pSat;
    iVar2 = sat_solver_nvars(p->pSat);
    iVar3 = Vec_WecSize(p->vCuts);
    sat_solver_setnvars(psVar1,iVar2 + iVar3);
    local_48 = (Vec_Int_t *)0x0;
    for (Lit = 0; iVar2 = Vec_WecSize(p->vObjCuts), Lit < iVar2; Lit = Lit + 1) {
      pVVar4 = Vec_WecEntry(p->vObjCuts,Lit);
      iVar2 = Vec_IntSize(pVVar4);
      if (iVar2 < 2) {
        __assert_fail("Vec_IntSize(vLits) >= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatMap.c"
                      ,0xa3,"int Sbm_ManCreateCnf(Sbm_Man_t *)");
      }
      psVar1 = p->pSat;
      piVar5 = Vec_IntArray(pVVar4);
      end = Vec_IntLimit(pVVar4);
      vLits._0_4_ = sat_solver_addclause(psVar1,piVar5,end);
      if ((int)vLits == 0) {
        __assert_fail("value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatMap.c"
                      ,0xa5,"int Sbm_ManCreateCnf(Sbm_Man_t *)");
      }
      if ((Lit & 1U) != 0) {
        iVar2 = Vec_IntEntryLast(pVVar4);
        vLits._4_4_ = Abc_LitNot(iVar2);
        iVar2 = Vec_IntEntryLast(local_48);
        value = Abc_LitNot(iVar2);
        vLits._0_4_ = sat_solver_addclause(p->pSat,(lit *)((long)&vLits + 4),Lits);
        if ((int)vLits == 0) {
          __assert_fail("value",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatMap.c"
                        ,0xba,"int Sbm_ManCreateCnf(Sbm_Man_t *)");
        }
      }
      local_48 = pVVar4;
    }
    for (Lit = 0; iVar2 = Vec_WecSize(p->vCuts), Lit < iVar2; Lit = Lit + 1) {
      pVVar4 = Vec_WecEntry(p->vCuts,Lit);
      for (Lits[1] = 0; iVar2 = Lits[1], iVar3 = Vec_IntSize(pVVar4), iVar2 < iVar3;
          Lits[1] = Lits[1] + 1) {
        Lits[0] = Vec_IntEntry(pVVar4,Lits[1]);
        iVar2 = Abc_Lit2Var(Lits[0]);
        if (iVar2 + -1 < p->nInputs) {
          if (Lits[1] < 1) {
            __assert_fail("k > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatMap.c"
                          ,0xc4,"int Sbm_ManCreateCnf(Sbm_Man_t *)");
          }
          iVar2 = Vec_WecSize(p->vObjCuts);
          iVar3 = Abc_Lit2Var(Lits[0]);
          vLits._4_4_ = Abc_Var2Lit(iVar2 + iVar3 + -1,0);
          value = Abc_Var2Lit(p->FirstVar + Lit,1);
          vLits._0_4_ = sat_solver_addclause(p->pSat,(lit *)((long)&vLits + 4),Lits);
          if ((int)vLits == 0) {
            __assert_fail("value",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatMap.c"
                          ,200,"int Sbm_ManCreateCnf(Sbm_Man_t *)");
          }
        }
        else {
          vLits._4_4_ = Abc_Var2Lit(Lits[0] - p->LitShift,0);
          value = Abc_Var2Lit(p->FirstVar + Lit,1);
          vLits._0_4_ = sat_solver_addclause(p->pSat,(lit *)((long)&vLits + 4),Lits);
          if ((int)vLits == 0) {
            __assert_fail("value",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatMap.c"
                          ,0xcf,"int Sbm_ManCreateCnf(Sbm_Man_t *)");
          }
        }
      }
    }
    psVar1 = p->pSat;
    piVar5 = Vec_IntArray(p->vPolar);
    iVar2 = Vec_IntSize(p->vPolar);
    sat_solver_set_polarity(psVar1,piVar5,iVar2);
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Sbm_ManCreateCnf( Sbm_Man_t * p )
{
    int i, k, Lit, Lits[2], value;
    Vec_Int_t * vLits, * vCutOne, * vLitsPrev;
    // sat_solver_rollback( p->Sat );
    if ( !Sbm_ManCheckSol(p, p->vSolCuts) )
        return 0;
    // increase var count
    assert( p->FirstVar == sat_solver_nvars(p->pSat) );
    sat_solver_setnvars( p->pSat, sat_solver_nvars(p->pSat) + Vec_WecSize(p->vCuts) );
    // iterate over arrays containing obj-lit cuts (neg-obj-lit cut-lits followed by pos-obj-lit cut-lits)
    vLitsPrev = NULL;
    Vec_WecForEachLevel( p->vObjCuts, vLits, i )
    {
        assert( Vec_IntSize(vLits) >= 2 );
        value = sat_solver_addclause( p->pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits)  );
        assert( value );
/*
        // for each cut, add implied nodes
        Lits[0] = Abc_LitNot( Vec_IntEntry(vLits, 0) );
        assert( Lits[0] < 2*p->FirstVar );
        Vec_IntForEachEntryStart( vLits, Lit, k, 1 )
        {
            assert( Lit >= 2*p->FirstVar );
            Lits[1] = Abc_LitNot( Lit );
            value = sat_solver_addclause( p->pSat, Lits, Lits + 2 );
            assert( value );
            //printf( "Adding clause %d + %d.\n", Lits[0], Lits[1]-2*p->FirstVar );
        }
*/
        //printf( "\n" );
        // create invertor exclusivity clause
        if ( i & 1 )
        {
            Lits[0] = Abc_LitNot( Vec_IntEntryLast(vLits) );
            Lits[1] = Abc_LitNot( Vec_IntEntryLast(vLitsPrev) );
            value = sat_solver_addclause( p->pSat, Lits, Lits + 2 );
            assert( value );
            //printf( "Adding exclusivity clause %d + %d.\n", Lits[0]-2*p->FirstVar, Lits[1]-2*p->FirstVar );
        }
        vLitsPrev = vLits;
    }
    // add inverters
    Vec_WecForEachLevel( p->vCuts, vCutOne, i )
        Vec_IntForEachEntry( vCutOne, Lit, k )
            if ( Abc_Lit2Var(Lit)-1 < p->nInputs ) // input
            {
                assert( k > 0 );
                Lits[0] = Abc_Var2Lit( Vec_WecSize(p->vObjCuts) + Abc_Lit2Var(Lit)-1, 0 );
                Lits[1] = Abc_Var2Lit( p->FirstVar + i, 1 );
                value = sat_solver_addclause( p->pSat, Lits, Lits + 2 );
                assert( value );
            }
            else // internal node
            {
                Lits[0] = Abc_Var2Lit( Lit-p->LitShift, 0 );
                Lits[1] = Abc_Var2Lit( p->FirstVar + i, 1 );
                value = sat_solver_addclause( p->pSat, Lits, Lits + 2 );
                assert( value );
            }

    sat_solver_set_polarity( p->pSat, Vec_IntArray(p->vPolar), Vec_IntSize(p->vPolar) );
    return 1;
}